

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall
testing::internal::TypedExpectation<void_(long_long)>::~TypedExpectation
          (TypedExpectation<void_(long_long)> *this)

{
  linked_ptr<testing::ActionInterface<void_(long_long)>_> *this_00;
  pointer ppvVar1;
  
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002a3fe8;
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  for (ppvVar1 = (this->super_ExpectationBase).untyped_actions_.
                 super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppvVar1 !=
      (this->super_ExpectationBase).untyped_actions_.
      super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppvVar1 = ppvVar1 + 1) {
    this_00 = (linked_ptr<testing::ActionInterface<void_(long_long)>_> *)*ppvVar1;
    if (this_00 != (linked_ptr<testing::ActionInterface<void_(long_long)>_> *)0x0) {
      linked_ptr<testing::ActionInterface<void_(long_long)>_>::~linked_ptr(this_00);
    }
    operator_delete(this_00);
  }
  linked_ptr<testing::ActionInterface<void_(long_long)>_>::~linked_ptr
            (&(this->repeated_action_).impl_);
  (this->extra_matcher_).
  super_MatcherBase<const_std::tr1::tuple<long_long,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002a3f50;
  linked_ptr<const_testing::MatcherInterface<const_std::tr1::tuple<long_long,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>_>
  ::~linked_ptr(&(this->extra_matcher_).
                 super_MatcherBase<const_std::tr1::tuple<long_long,_void,_void,_void,_void,_void,_void,_void,_void,_void>_&>
                 .impl_);
  (this->matchers_).f0_.super_MatcherBase<long_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a3f30;
  linked_ptr<const_testing::MatcherInterface<long_long>_>::~linked_ptr
            (&(this->matchers_).f0_.super_MatcherBase<long_long>.impl_);
  ExpectationBase::~ExpectationBase(&this->super_ExpectationBase);
  return;
}

Assistant:

virtual ~TypedExpectation() {
    // Check the validity of the action count if it hasn't been done
    // yet (for example, if the expectation was never used).
    CheckActionCountIfNotDone();
    for (UntypedActions::const_iterator it = untyped_actions_.begin();
         it != untyped_actions_.end(); ++it) {
      delete static_cast<const Action<F>*>(*it);
    }
  }